

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::keyboardSearch(QAbstractItemView *this,QString *search)

{
  QPersistentModelIndex *this_00;
  long lVar1;
  long *plVar2;
  QArrayData *pQVar3;
  const_iterator __first1;
  long lVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  const_iterator cVar9;
  ulong uVar10;
  bool bVar11;
  QArrayData *pQVar12;
  long lVar13;
  undefined1 *puVar14;
  long in_FS_OFFSET;
  int local_124;
  int local_114;
  QAbstractItemModel *local_110;
  undefined1 *local_100;
  QArrayData *local_d0;
  const_iterator cStack_c8;
  long local_c0;
  QModelIndex local_b8;
  QModelIndex local_98;
  QModelIndex local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  plVar2 = *(long **)(lVar1 + 0x2f8);
  this_00 = (QPersistentModelIndex *)(lVar1 + 0x3b8);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
  iVar6 = (**(code **)(*plVar2 + 0x78))(plVar2,&local_58);
  if (iVar6 != 0) {
    plVar2 = *(long **)(lVar1 + 0x2f8);
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,this_00);
    iVar6 = (**(code **)(*plVar2 + 0x80))(plVar2,&local_78);
    if (iVar6 != 0) {
      puVar14 = &DAT_aaaaaaaaaaaaaaaa;
      local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      currentIndex((QModelIndex *)&local_58,this);
      if ((((int)local_58._0_4_ < 0) || ((long)local_58.shared < 0)) ||
         ((long *)local_58._16_8_ == (long *)0x0)) {
        plVar2 = *(long **)(lVar1 + 0x2f8);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_98,this_00);
        (**(code **)(*plVar2 + 0x60))(&local_78,plVar2,0,0,&local_98);
      }
      else {
        currentIndex(&local_78,this);
      }
      cVar5 = QElapsedTimer::isValid();
      if (cVar5 == '\0') {
        QElapsedTimer::start();
      }
      else {
        puVar14 = (undefined1 *)QElapsedTimer::restart();
      }
      if ((cVar5 == '\x01' && (search->d).size != 0) &&
         (iVar6 = QApplication::keyboardInputInterval(), (long)puVar14 <= (long)iVar6)) {
        QString::append((QString *)(lVar1 + 0x3f0));
        bVar11 = false;
      }
      else {
        QString::operator=((QString *)(lVar1 + 0x3f0),(QString *)search);
        currentIndex((QModelIndex *)&local_58,this);
        bVar11 = (long *)local_58._16_8_ != (long *)0x0 &&
                 -1 < (int)(local_58._4_4_ | local_58._0_4_);
      }
      if ((1 < *(ulong *)(lVar1 + 0x400)) &&
         (iVar6 = QString::count((QChar)(char16_t)(QString *)(lVar1 + 0x3f0),
                                 (uint)*(ushort *)
                                        (*(long *)(lVar1 + 0x3f8) + -2 +
                                        *(ulong *)(lVar1 + 0x400) * 2)),
         (long)iVar6 == *(long *)(lVar1 + 0x400))) {
        bVar11 = true;
      }
      if (bVar11) {
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        if (local_78.m.ptr == (QAbstractItemModel *)0x0) {
          local_58._forAlignment = -NAN;
          local_58._8_8_ = (undefined1 *)0x0;
          local_58._16_8_ = (long *)0x0;
        }
        else {
          (**(code **)(*(long *)local_78.m.ptr + 0x68))(&local_58,local_78.m.ptr,&local_78);
        }
        iVar6 = local_78.r;
        iVar7 = (**(code **)(**(long **)(lVar1 + 0x2f8) + 0x78))
                          (*(long **)(lVar1 + 0x2f8),&local_58);
        iVar8 = 0;
        if (iVar6 < iVar7 + -1) {
          iVar8 = local_78.r + 1;
        }
        (**(code **)(**(long **)(lVar1 + 0x2f8) + 0x60))
                  (&local_98,*(long **)(lVar1 + 0x2f8),iVar8,local_78.c,&local_58);
        local_78.m.ptr = local_98.m.ptr;
        local_78.r = local_98.r;
        local_78.c = local_98.c;
        local_78.i = local_98.i;
      }
      local_98.m.ptr = local_78.m.ptr;
      local_98.r = local_78.r;
      local_98.c = local_78.c;
      local_98.i = local_78.i;
      local_b8._0_8_ = (PrivateShared *)0xffffffffffffffff;
      local_b8.i = 0;
      local_b8.m.ptr = (QAbstractItemModel *)0x0;
      local_114 = -1;
      local_100 = (undefined1 *)0x0;
      local_110 = (QAbstractItemModel *)0x0;
      local_124 = -1;
      cVar9.i = (QModelIndex *)0x0;
      pQVar12 = (QArrayData *)0x0;
      lVar13 = 0;
LAB_00542d20:
      plVar2 = *(long **)(lVar1 + 0x2f8);
      ::QVariant::QVariant((QVariant *)&local_58,(QString *)(lVar1 + 0x3f0));
      (**(code **)(*plVar2 + 0x150))(&local_d0,plVar2,&local_98,0,&local_58,1,0x22);
      lVar4 = local_c0;
      __first1.i = cStack_c8.i;
      pQVar3 = local_d0;
      local_d0 = (QArrayData *)0x0;
      cStack_c8.i = (QModelIndex *)0x0;
      local_c0 = 0;
      if (pQVar12 != (QArrayData *)0x0) {
        LOCK();
        (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar12,0x18,0x10);
        }
      }
      if (local_d0 != (QArrayData *)0x0) {
        LOCK();
        (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_d0,0x18,0x10);
        }
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
      if ((lVar4 == lVar13) &&
         ((__first1.i == cVar9.i ||
          (bVar11 = std::__equal<false>::
                    equal<QList<QModelIndex>::const_iterator,QList<QModelIndex>::const_iterator>
                              (__first1,__first1.i + lVar4,cVar9), bVar11)))) goto LAB_005430ec;
      local_58._forAlignment = -NAN;
      local_58._8_8_ = (undefined1 *)0x0;
      local_58._16_8_ = (long *)0x0;
      cVar9.i = __first1.i;
      if (lVar4 == 0) {
        cVar9.i = (QModelIndex *)&local_58;
      }
      local_b8.m.ptr = *(QAbstractItemModel **)((long)cVar9.i + 0x10);
      local_b8._0_8_ = *(undefined8 *)cVar9.i;
      local_b8.i = *(quintptr *)((long)cVar9.i + 8);
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (pQVar12 != (QArrayData *)0x0) {
        LOCK();
        (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar12,0x18,0x10);
        }
      }
      pQVar12 = pQVar3;
      if (((-1 < local_b8.r) && (-1 < (long)local_b8._0_8_)) &&
         (local_b8.m.ptr != (QAbstractItemModel *)0x0)) {
        uVar10 = (**(code **)(**(long **)(lVar1 + 0x2f8) + 0x138))
                           (*(long **)(lVar1 + 0x2f8),&local_b8);
        if ((uVar10 & 0x20) != 0) {
          setCurrentIndex(this,&local_b8);
LAB_005430ec:
          if (pQVar12 != (QArrayData *)0x0) {
            LOCK();
            (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar12,0x18,0x10);
            }
          }
          if (pQVar3 != (QArrayData *)0x0) {
            LOCK();
            (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar3,0x18,0x10);
            }
          }
          goto LAB_00543127;
        }
        iVar6 = local_b8.r;
        plVar2 = *(long **)(lVar1 + 0x2f8);
        if (local_b8.m.ptr == (QAbstractItemModel *)0x0) {
          local_58._forAlignment = -NAN;
          local_58._8_8_ = (undefined1 *)0x0;
          local_58._16_8_ = (long *)0x0;
        }
        else {
          (**(code **)(*(long *)local_b8.m.ptr + 0x68))(&local_58,local_b8.m.ptr,&local_b8);
        }
        iVar6 = iVar6 + 1;
        iVar8 = (**(code **)(*plVar2 + 0x78))(plVar2,&local_58);
        if (iVar8 <= iVar6) {
          iVar6 = 0;
        }
        if (local_b8.m.ptr == (QAbstractItemModel *)0x0) {
          local_58._forAlignment = -NAN;
          local_58._8_8_ = (undefined1 *)0x0;
          local_58._16_8_ = (long *)0x0;
        }
        else if (local_b8.r == iVar6) {
          local_58._16_8_ = local_b8.m.ptr;
          local_58._0_4_ = local_b8.r;
          local_58._4_4_ = local_b8.c;
          local_58._8_8_ = local_b8.i;
        }
        else {
          (**(code **)(*(long *)local_b8.m.ptr + 0x70))
                    (&local_58,local_b8.m.ptr,iVar6,local_b8.c,&local_b8);
        }
        local_98.m.ptr = (QAbstractItemModel *)local_58._16_8_;
        local_98.r = local_58._0_4_;
        local_98.c = local_58._4_4_;
        local_98.i = local_58._8_8_;
        if (((local_124 < 0) || (local_114 < 0)) || (local_110 == (QAbstractItemModel *)0x0)) {
          local_114 = local_b8.c;
          local_100 = (undefined1 *)local_b8.i;
          bVar11 = true;
          local_110 = local_b8.m.ptr;
          local_124 = local_b8.r;
        }
        else {
          bVar11 = true;
          if (((local_124 == local_b8.r) && (local_114 == local_b8.c)) &&
             (local_100 == (undefined1 *)local_b8.i)) {
            bVar11 = local_110 != local_b8.m.ptr;
          }
        }
        if (!bVar11) goto LAB_005430ec;
      }
      if (local_98.r == local_78.r) {
        if (((local_98.c == local_78.c) && (local_98.i == local_78.i)) &&
           (local_98.m.ptr == local_78.m.ptr)) goto LAB_005430ec;
      }
      if (((local_b8.r < 0) || ((long)local_b8._0_8_ < 0)) ||
         (cVar9.i = __first1.i, lVar13 = lVar4, local_b8.m.ptr == (QAbstractItemModel *)0x0))
      goto LAB_005430ec;
      goto LAB_00542d20;
    }
  }
LAB_00543127:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::keyboardSearch(const QString &search)
{
    Q_D(QAbstractItemView);
    if (!d->model->rowCount(d->root) || !d->model->columnCount(d->root))
        return;

    QModelIndex start = currentIndex().isValid() ? currentIndex()
                        : d->model->index(0, 0, d->root);
    bool skipRow = false;
    bool keyboardTimeWasValid = d->keyboardInputTime.isValid();
    qint64 keyboardInputTimeElapsed;
    if (keyboardTimeWasValid)
        keyboardInputTimeElapsed = d->keyboardInputTime.restart();
    else
        d->keyboardInputTime.start();
    if (search.isEmpty() || !keyboardTimeWasValid
        || keyboardInputTimeElapsed > QApplication::keyboardInputInterval()) {
        d->keyboardInput = search;
        skipRow = currentIndex().isValid(); //if it is not valid we should really start at QModelIndex(0,0)
    } else {
        d->keyboardInput += search;
    }

    // special case for searches with same key like 'aaaaa'
    bool sameKey = false;
    if (d->keyboardInput.size() > 1) {
        int c = d->keyboardInput.count(d->keyboardInput.at(d->keyboardInput.size() - 1));
        sameKey = (c == d->keyboardInput.size());
        if (sameKey)
            skipRow = true;
    }

    // skip if we are searching for the same key or a new search started
    if (skipRow) {
        QModelIndex parent = start.parent();
        int newRow = (start.row() < d->model->rowCount(parent) - 1) ? start.row() + 1 : 0;
        start = d->model->index(newRow, start.column(), parent);
    }

    // search from start with wraparound
    QModelIndex current = start;
    QModelIndexList match;
    QModelIndex firstMatch;
    QModelIndex startMatch;
    QModelIndexList previous;
    do {
        match = d->model->match(current, Qt::DisplayRole, d->keyboardInput);
        if (match == previous)
            break;
        firstMatch = match.value(0);
        previous = match;
        if (firstMatch.isValid()) {
            if (d->isIndexEnabled(firstMatch)) {
                setCurrentIndex(firstMatch);
                break;
            }
            int row = firstMatch.row() + 1;
            if (row >= d->model->rowCount(firstMatch.parent()))
                row = 0;
            current = firstMatch.sibling(row, firstMatch.column());

            //avoid infinite loop if all the matching items are disabled.
            if (!startMatch.isValid())
                startMatch = firstMatch;
            else if (startMatch == firstMatch)
                break;
        }
    } while (current != start && firstMatch.isValid());
}